

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O2

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
UnPop<UnifiedRegex::RewindLoopFixedCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  code *pcVar1;
  bool bVar2;
  size_t *psVar3;
  undefined4 *puVar4;
  
  ContinuousPageStack<1UL>::UnPop(&this->super_ContinuousPageStack<1UL>,0x20);
  psVar3 = (size_t *)ContinuousPageStack<1UL>::Top(&this->super_ContinuousPageStack<1UL>,0x20);
  if (*psVar3 != this->topElementSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x207,
                       "(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize)"
                       ,
                       "reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->topElementSize = 0x20;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::UnPop()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    ContinuousPageStack<InitialPageCount>::UnPop(VariableElement::template
    Size<ActualT>());
    Assert(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template
    Size<ActualT>()))->PreviousElementSize() == topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
}